

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.cpp
# Opt level: O0

void SignalHandler(int signal,siginfo_t *sigInfo,void *context)

{
  ostream *poVar1;
  long in_RSI;
  int in_EDI;
  long *in_FS_OFFSET;
  int trace;
  int numberAddresses;
  char **strings;
  int local_28;
  int local_24;
  void *local_20;
  
  if (*(int *)(in_RSI + 0x18) != 0x42424242) {
    pthread_mutex_lock((pthread_mutex_t *)&gHandlerLock);
    if ((*(byte *)(*in_FS_OFFSET + -8) & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "Oops! Something went wrong in the simulation library");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"Exception ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
    poVar1 = std::operator<<(poVar1," occured at ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(void **)(in_RSI + 0x10));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_24 = backtrace(gBuffer,0x100);
    if ((local_24 != 0) &&
       (local_20 = (void *)backtrace_symbols(gBuffer,local_24), local_20 == (void *)0x0)) {
      local_24 = 0;
    }
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(local_24 + -1) - local_28)
      ;
      poVar1 = std::operator<<(poVar1,": ");
      poVar1 = std::operator<<(poVar1,*(char **)((long)local_20 + (long)local_28 * 8));
      std::operator<<(poVar1,"\n");
    }
    pthread_mutex_unlock((pthread_mutex_t *)&gHandlerLock);
    free(local_20);
  }
  if ((*(byte *)(*in_FS_OFFSET + -8) & 1) == 0) {
    return;
  }
  longjmp((__jmp_buf_tag *)(*in_FS_OFFSET + -0xd0),in_EDI);
}

Assistant:

void SignalHandler(int signal, siginfo_t * sigInfo, void * context)
{
    UNUSED_PARAMETER(context);

    /* If the signal wasn't sent on purpose by ourselves, then, it indicates
     * a broken behavior in either HPCsim or the called simulation.
     * We'll have to provide a backtrace to help debugging.
     */
    if (sigInfo->si_int != HPCSIM_MAGIC_MARKER)
    {
        char ** strings;
        int numberAddresses, trace;

        /* Lock the handler lock for two reasons:
         * First, we don't want to have a race condition accessing standard error
         * Our backtrace must be crystal clear
         * Second, the gBuffer is shared between all the instances of the handler
         * so, make sure it is only used by one at a time
         */
        pthread_mutex_lock(&gHandlerLock);

        /* If the signal occured while in a try block, it is the simulation shared object
         * which is failing. Inform the user
         */
        if (gInTry)
        {
            std::cerr << "Oops! Something went wrong in the simulation library" << std::endl;
        }
        std::cerr << "Exception " << signal << " occured at " << sigInfo->si_addr << std::endl;

        /* Get the backtrace which lead to the error */
        numberAddresses = backtrace(gBuffer, BUFFER_SIZE);
        if (numberAddresses != 0)
        {
            /* Try to resolve symbols */
            strings = backtrace_symbols(gBuffer, numberAddresses);
            if (strings == 0)
            {
                numberAddresses = 0;
            }
        }

        /* Print the backtrace */
        for (trace = 0; trace < numberAddresses; ++trace)
        {
            std::cerr << (numberAddresses - 1 - trace) << ": " << strings[trace] << "\n";
        }

        /* No need for the lock any longer */
        pthread_mutex_unlock(&gHandlerLock);

        free(strings);
    }

    /* If we were in a try block, jump to the exception handler */
    if (gInTry)
    {
        longjmp(gJumpEnv, signal);
    }
}